

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFanout.c
# Opt level: O3

void Fraig_NodeRemoveFaninFanout(Fraig_Node_t *pFanin,Fraig_Node_t *pFanoutToRemove)

{
  Fraig_Node_t *pFVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t **ppFVar3;
  
  ppFVar3 = &pFanin->pFanPivot;
  pFVar1 = pFanin->pFanPivot;
  while (pFVar2 = pFVar1, pFVar2 != (Fraig_Node_t *)0x0) {
    pFVar1 = (&pFVar2->pFanFanin1)
             [(Fraig_Node_t *)((ulong)pFVar2->p1 & 0xfffffffffffffffe) != pFanin];
    if (pFVar2 != pFanoutToRemove) {
      *ppFVar3 = pFVar2;
      ppFVar3 = &pFVar2->pFanFanin1 +
                ((Fraig_Node_t *)((ulong)pFVar2->p1 & 0xfffffffffffffffe) != pFanin);
    }
  }
  *ppFVar3 = (Fraig_Node_t *)0x0;
  return;
}

Assistant:

void Fraig_NodeRemoveFaninFanout( Fraig_Node_t * pFanin, Fraig_Node_t * pFanoutToRemove )
{
    Fraig_Node_t * pFanout, * pFanout2, ** ppFanList;
    // start the linked list of fanouts
    ppFanList = &pFanin->pFanPivot; 
    // go through the fanouts
    Fraig_NodeForEachFanoutSafe( pFanin, pFanout, pFanout2 )
    {
        // skip the fanout-to-remove
        if ( pFanout == pFanoutToRemove )
            continue;
        // add useful fanouts to the list
        *ppFanList = pFanout;
        ppFanList = Fraig_NodeReadNextFanoutPlace( pFanin, pFanout );
    }
    *ppFanList = NULL;
}